

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::trivialHeuristic(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *lp)

{
  uint uVar1;
  bool bVar2;
  type_conflict5 tVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  element_type *peVar7;
  ulong *puVar8;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  cpp_dec_float<100U,_int,_void> *in_RSI;
  long in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  upper;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lower;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  int k;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *col;
  int j;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  largeValue;
  bool zerovalid;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lockObj;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  upperObj;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowerObj;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  zeroObj;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  downLocks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  upLocks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  locksol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  uppersol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  lowersol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  zerosol;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_7;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_7;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_ffffffffffffe8a8;
  undefined2 in_stack_ffffffffffffe8ac;
  undefined1 in_stack_ffffffffffffe8ae;
  undefined1 in_stack_ffffffffffffe8af;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe8b0;
  undefined4 in_stack_ffffffffffffe8b8;
  undefined1 in_stack_ffffffffffffe8bc;
  undefined1 in_stack_ffffffffffffe8bd;
  undefined1 in_stack_ffffffffffffe8be;
  undefined1 in_stack_ffffffffffffe8bf;
  cpp_dec_float<100U,_int,_void> *in_stack_ffffffffffffe8c0;
  undefined5 in_stack_ffffffffffffe8c8;
  undefined1 in_stack_ffffffffffffe8cd;
  undefined1 in_stack_ffffffffffffe8ce;
  undefined1 in_stack_ffffffffffffe8cf;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe8d0;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe8e8;
  undefined1 *in_stack_ffffffffffffe8f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe8f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe900;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe908;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe910;
  bool local_16ba;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_16b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe950;
  undefined7 in_stack_ffffffffffffe958;
  undefined1 in_stack_ffffffffffffe95f;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffe960;
  undefined7 in_stack_ffffffffffffe968;
  bool local_15c2;
  undefined1 local_14d0 [56];
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffeb68;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffeb70;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffeb78;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1480;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1430;
  undefined8 local_13e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_13d8;
  undefined1 local_1388 [80];
  undefined8 local_1338 [11];
  undefined8 local_12e0;
  undefined1 local_12d8 [80];
  undefined1 local_1288 [160];
  undefined8 local_11e8;
  undefined1 local_11e0 [80];
  undefined1 local_1190 [96];
  undefined1 local_1130 [80];
  undefined1 local_10e0 [80];
  undefined1 local_1090 [80];
  undefined1 local_1040 [96];
  ulong local_fe0;
  undefined1 local_fd8 [80];
  undefined1 local_f88 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_f38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ee8 [2];
  undefined4 local_e48;
  undefined4 local_df4;
  undefined1 local_de0 [80];
  undefined1 local_d90 [160];
  undefined4 local_cf0;
  undefined4 local_c9c;
  ulong local_c88;
  undefined1 local_c7c [80];
  undefined1 local_c2c [243];
  byte local_b39;
  undefined1 local_b28 [80];
  undefined1 local_ad8 [96];
  ulong local_a78;
  undefined1 local_a6c [80];
  undefined1 local_a1c [80];
  undefined1 local_9cc [80];
  uint local_97c;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_978;
  undefined4 local_96c;
  undefined4 local_968;
  int local_964;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_960;
  undefined8 local_910;
  undefined1 local_908 [96];
  undefined1 local_8a8 [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_858;
  undefined8 local_808;
  undefined1 local_7fc [80];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7ac;
  byte local_759;
  undefined1 local_758 [80];
  undefined1 local_708 [80];
  undefined1 local_6b8 [80];
  undefined1 local_668 [240];
  cpp_dec_float<100U,_int,_void> *local_578;
  undefined8 local_568;
  undefined8 local_560;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_558;
  undefined8 local_550;
  undefined8 local_548;
  undefined1 *local_540;
  undefined8 local_538;
  ulong *local_530;
  undefined1 *local_528;
  undefined8 local_520;
  undefined8 local_518;
  undefined1 *local_510;
  undefined8 local_508;
  ulong *local_500;
  undefined1 *local_4f8;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined1 *local_4e0;
  undefined8 local_4d8;
  ulong *local_4d0;
  undefined1 *local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined1 *local_4b0;
  undefined8 local_4a8;
  undefined8 *local_4a0;
  undefined1 *local_498;
  undefined8 local_490;
  undefined8 *local_488;
  undefined1 *local_480;
  undefined4 *local_478;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_470;
  undefined4 *local_468;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_460;
  long local_458;
  undefined1 *local_450;
  long local_448;
  undefined1 *local_440;
  long local_438;
  undefined1 *local_430;
  long local_428;
  undefined1 *local_420;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_418;
  undefined1 *local_410;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_408;
  undefined1 *local_400;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3f8;
  undefined1 *local_3f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3e8;
  undefined1 *local_3e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3d8;
  undefined1 *local_3d0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a8;
  undefined1 *local_3a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_398;
  undefined1 *local_390;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_388;
  undefined1 *local_380;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_378;
  undefined1 *local_370;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_350;
  undefined1 *local_348;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_340;
  undefined1 *local_338;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_330;
  undefined1 *local_328;
  long local_320;
  undefined1 *local_318;
  long local_310;
  undefined1 *local_308;
  long local_300;
  undefined1 *local_2f8;
  long local_2f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a0;
  undefined4 *local_298;
  undefined4 *local_290;
  undefined8 *local_288;
  undefined8 *local_280;
  undefined8 local_278;
  ulong *local_270;
  undefined8 local_268;
  ulong *local_260;
  undefined8 local_258;
  ulong *local_250;
  undefined8 local_248;
  undefined8 local_240;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_231;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_230;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_210;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_208;
  undefined1 *local_200;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1f1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1b1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_188;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_180;
  undefined8 *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  undefined8 *local_168;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_159;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_119;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  undefined1 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_e9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  undefined8 *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  undefined1 *local_90;
  undefined8 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined8 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  undefined8 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_578 = in_RSI;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x577b74);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffe8c0,
               CONCAT13(in_stack_ffffffffffffe8bf,
                        CONCAT12(in_stack_ffffffffffffe8be,
                                 CONCAT11(in_stack_ffffffffffffe8bd,in_stack_ffffffffffffe8bc))));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x577b90);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffe8c0,
               CONCAT13(in_stack_ffffffffffffe8bf,
                        CONCAT12(in_stack_ffffffffffffe8be,
                                 CONCAT11(in_stack_ffffffffffffe8bd,in_stack_ffffffffffffe8bc))));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x577bbc);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffe8c0,
               CONCAT13(in_stack_ffffffffffffe8bf,
                        CONCAT12(in_stack_ffffffffffffe8be,
                                 CONCAT11(in_stack_ffffffffffffe8bd,in_stack_ffffffffffffe8bc))));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x577be8);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffe8c0,
               CONCAT13(in_stack_ffffffffffffe8bf,
                        CONCAT12(in_stack_ffffffffffffe8be,
                                 CONCAT11(in_stack_ffffffffffffe8bd,in_stack_ffffffffffffe8bc))));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x577c14);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffe8c0,
               CONCAT13(in_stack_ffffffffffffe8bf,
                        CONCAT12(in_stack_ffffffffffffe8be,
                                 CONCAT11(in_stack_ffffffffffffe8bd,in_stack_ffffffffffffe8bc))));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x577c40);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffe8c0,
               CONCAT13(in_stack_ffffffffffffe8bf,
                        CONCAT12(in_stack_ffffffffffffe8be,
                                 CONCAT11(in_stack_ffffffffffffe8bd,in_stack_ffffffffffffe8bc))));
  lVar6 = in_RDI + 0x38;
  local_450 = local_668;
  local_458 = lVar6;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
             (cpp_dec_float<100U,_int,_void> *)
             CONCAT17(in_stack_ffffffffffffe8af,
                      CONCAT16(in_stack_ffffffffffffe8ae,
                               CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))));
  local_440 = local_6b8;
  local_448 = lVar6;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
             (cpp_dec_float<100U,_int,_void> *)
             CONCAT17(in_stack_ffffffffffffe8af,
                      CONCAT16(in_stack_ffffffffffffe8ae,
                               CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))));
  local_430 = local_708;
  local_438 = lVar6;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
             (cpp_dec_float<100U,_int,_void> *)
             CONCAT17(in_stack_ffffffffffffe8af,
                      CONCAT16(in_stack_ffffffffffffe8ae,
                               CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))));
  local_420 = local_758;
  local_428 = lVar6;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
             (cpp_dec_float<100U,_int,_void> *)
             CONCAT17(in_stack_ffffffffffffe8af,
                      CONCAT16(in_stack_ffffffffffffe8ae,
                               CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))));
  local_759 = 1;
  local_560 = infinity();
  local_558 = &local_7ac;
  local_568 = 0;
  local_240 = local_560;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (in_stack_ffffffffffffe8c0,
             (double)CONCAT17(in_stack_ffffffffffffe8bf,
                              CONCAT16(in_stack_ffffffffffffe8be,
                                       CONCAT15(in_stack_ffffffffffffe8bd,
                                                CONCAT14(in_stack_ffffffffffffe8bc,
                                                         in_stack_ffffffffffffe8b8)))),
             in_stack_ffffffffffffe8b0);
  local_808 = 0x3ff0000000000000;
  feastol(in_stack_ffffffffffffe8e8);
  local_30 = &local_808;
  local_38 = &local_858;
  local_28 = local_7fc;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_39,local_38);
  local_20 = local_7fc;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0);
  local_8 = local_30;
  local_18 = local_38;
  local_10 = local_7fc;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
             (double *)
             CONCAT17(in_stack_ffffffffffffe8af,
                      CONCAT16(in_stack_ffffffffffffe8ae,
                               CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))),
             (cpp_dec_float<100U,_int,_void> *)0x577e81);
  local_548 = infinity();
  local_540 = local_8a8;
  local_550 = 0;
  local_248 = local_548;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (in_stack_ffffffffffffe8c0,
             (double)CONCAT17(in_stack_ffffffffffffe8bf,
                              CONCAT16(in_stack_ffffffffffffe8be,
                                       CONCAT15(in_stack_ffffffffffffe8bd,
                                                CONCAT14(in_stack_ffffffffffffe8bc,
                                                         in_stack_ffffffffffffe8b8)))),
             in_stack_ffffffffffffe8b0);
  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT17(in_stack_ffffffffffffe8af,
                           CONCAT16(in_stack_ffffffffffffe8ae,
                                    CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))))
  ;
  peVar7 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x577f09);
  Tolerances::epsilon(peVar7);
  bVar2 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                    (in_stack_ffffffffffffe910,in_stack_ffffffffffffe908,
                     (double)in_stack_ffffffffffffe900);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x577f50);
  if (bVar2) {
    local_910 = 0x3ff0000000000000;
    feastol(in_stack_ffffffffffffe8e8);
    local_70 = &local_910;
    local_78 = &local_960;
    local_68 = local_908;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_79,local_78);
    local_60 = local_908;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0);
    local_48 = local_70;
    local_58 = local_78;
    local_50 = local_908;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
               (double *)
               CONCAT17(in_stack_ffffffffffffe8af,
                        CONCAT16(in_stack_ffffffffffffe8ae,
                                 CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))),
               (cpp_dec_float<100U,_int,_void> *)0x578040);
    local_330 = &local_7ac;
    local_338 = local_908;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe8af,
                        CONCAT16(in_stack_ffffffffffffe8ae,
                                 CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))));
  }
  local_964 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x578147);
  while (local_964 = local_964 + -1, -1 < local_964) {
    local_968 = 0;
    local_460 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe8b0,
                             CONCAT13(in_stack_ffffffffffffe8af,
                                      CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac))
                            );
    local_468 = &local_968;
    local_298 = local_468;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
               CONCAT17(in_stack_ffffffffffffe8af,
                        CONCAT16(in_stack_ffffffffffffe8ae,
                                 CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))));
    local_96c = 0;
    local_470 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe8b0,
                             CONCAT13(in_stack_ffffffffffffe8af,
                                      CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac))
                            );
    local_478 = &local_96c;
    local_290 = local_478;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
               CONCAT17(in_stack_ffffffffffffe8af,
                        CONCAT16(in_stack_ffffffffffffe8ae,
                                 CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))));
    local_978 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::colVector(in_stack_ffffffffffffe8b0,
                            CONCAT13(in_stack_ffffffffffffe8af,
                                     CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac)))
    ;
    for (local_97c = 0; uVar1 = local_97c,
        iVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(local_978), (int)uVar1 < iVar5; local_97c = local_97c + 1) {
      local_418 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::value(local_978,local_97c);
      local_410 = local_9cc;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffe8af,
                          CONCAT16(in_stack_ffffffffffffe8ae,
                                   CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))));
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::index(local_978,(char *)(ulong)local_97c,__c);
      local_b39 = 0;
      local_408 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::lhs(in_stack_ffffffffffffe8b0,
                        CONCAT13(in_stack_ffffffffffffe8af,
                                 CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac)));
      local_400 = local_a1c;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffe8af,
                          CONCAT16(in_stack_ffffffffffffe8ae,
                                   CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))));
      puVar8 = (ulong *)infinity();
      local_a78 = *puVar8 ^ 0x8000000000000000;
      local_528 = local_a6c;
      local_530 = &local_a78;
      local_538 = 0;
      local_250 = local_530;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffe8c0,
                 (double)CONCAT17(in_stack_ffffffffffffe8bf,
                                  CONCAT16(in_stack_ffffffffffffe8be,
                                           CONCAT15(in_stack_ffffffffffffe8bd,
                                                    CONCAT14(in_stack_ffffffffffffe8bc,
                                                             in_stack_ffffffffffffe8b8)))),
                 in_stack_ffffffffffffe8b0);
      SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)CONCAT17(in_stack_ffffffffffffe8af,
                               CONCAT16(in_stack_ffffffffffffe8ae,
                                        CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8
                                                ))));
      peVar7 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x5783f9);
      Tolerances::epsilon(peVar7);
      bVar2 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8,
                         (double)in_stack_ffffffffffffe8f0);
      local_15c2 = false;
      if (bVar2) {
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::index(local_978,(char *)(ulong)local_97c,__c_00);
        local_3f8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::rhs(in_stack_ffffffffffffe8b0,
                          CONCAT13(in_stack_ffffffffffffe8af,
                                   CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac)));
        local_3f0 = local_ad8;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffe8af,
                            CONCAT16(in_stack_ffffffffffffe8ae,
                                     CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8)))
                  );
        local_518 = infinity();
        local_510 = local_b28;
        local_520 = 0;
        local_258 = local_518;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  (in_stack_ffffffffffffe8c0,
                   (double)CONCAT17(in_stack_ffffffffffffe8bf,
                                    CONCAT16(in_stack_ffffffffffffe8be,
                                             CONCAT15(in_stack_ffffffffffffe8bd,
                                                      CONCAT14(in_stack_ffffffffffffe8bc,
                                                               in_stack_ffffffffffffe8b8)))),
                   in_stack_ffffffffffffe8b0);
        SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT17(in_stack_ffffffffffffe8af,
                                 CONCAT16(in_stack_ffffffffffffe8ae,
                                          CONCAT24(in_stack_ffffffffffffe8ac,
                                                   in_stack_ffffffffffffe8a8))));
        local_b39 = 1;
        peVar7 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x57854b);
        Tolerances::epsilon(peVar7);
        local_15c2 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                               (in_stack_ffffffffffffe910,in_stack_ffffffffffffe908,
                                (double)in_stack_ffffffffffffe900);
      }
      if ((local_b39 & 1) != 0) {
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x5785bc)
        ;
      }
      std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x5785c9);
      if (local_15c2 == false) {
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::index(local_978,(char *)(ulong)local_97c,__c_01);
        local_3e8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::lhs(in_stack_ffffffffffffe8b0,
                          CONCAT13(in_stack_ffffffffffffe8af,
                                   CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac)));
        local_3e0 = local_c2c;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffe8af,
                            CONCAT16(in_stack_ffffffffffffe8ae,
                                     CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8)))
                  );
        puVar8 = (ulong *)infinity();
        local_c88 = *puVar8 ^ 0x8000000000000000;
        local_4f8 = local_c7c;
        local_500 = &local_c88;
        local_508 = 0;
        local_260 = local_500;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  (in_stack_ffffffffffffe8c0,
                   (double)CONCAT17(in_stack_ffffffffffffe8bf,
                                    CONCAT16(in_stack_ffffffffffffe8be,
                                             CONCAT15(in_stack_ffffffffffffe8bd,
                                                      CONCAT14(in_stack_ffffffffffffe8bc,
                                                               in_stack_ffffffffffffe8b8)))),
                   in_stack_ffffffffffffe8b0);
        SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT17(in_stack_ffffffffffffe8af,
                                 CONCAT16(in_stack_ffffffffffffe8ae,
                                          CONCAT24(in_stack_ffffffffffffe8ac,
                                                   in_stack_ffffffffffffe8a8))));
        peVar7 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x57879b);
        Tolerances::epsilon(peVar7);
        bVar2 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8,
                           (double)in_stack_ffffffffffffe8f0);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x5787e2)
        ;
        if (bVar2) {
          local_c9c = 0;
          tVar3 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT17(in_stack_ffffffffffffe8bf,
                                         CONCAT16(in_stack_ffffffffffffe8be,
                                                  CONCAT15(in_stack_ffffffffffffe8bd,
                                                           CONCAT14(in_stack_ffffffffffffe8bc,
                                                                    in_stack_ffffffffffffe8b8)))),
                             (int *)in_stack_ffffffffffffe8b0);
          if (tVar3) {
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)in_stack_ffffffffffffe8b0,
                         CONCAT13(in_stack_ffffffffffffe8af,
                                  CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac)));
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            ::operator++((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(in_stack_ffffffffffffe8bf,
                                     CONCAT16(in_stack_ffffffffffffe8be,
                                              CONCAT15(in_stack_ffffffffffffe8bd,
                                                       CONCAT14(in_stack_ffffffffffffe8bc,
                                                                in_stack_ffffffffffffe8b8)))),
                         (int)((ulong)in_stack_ffffffffffffe8b0 >> 0x20));
          }
          else {
            local_cf0 = 0;
            tVar3 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT17(in_stack_ffffffffffffe8bf,
                                           CONCAT16(in_stack_ffffffffffffe8be,
                                                    CONCAT15(in_stack_ffffffffffffe8bd,
                                                             CONCAT14(in_stack_ffffffffffffe8bc,
                                                                      in_stack_ffffffffffffe8b8)))),
                               (int *)in_stack_ffffffffffffe8b0);
            if (tVar3) {
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_ffffffffffffe8b0,
                           CONCAT13(in_stack_ffffffffffffe8af,
                                    CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac)));
              boost::multiprecision::
              number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              ::operator++((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT17(in_stack_ffffffffffffe8bf,
                                       CONCAT16(in_stack_ffffffffffffe8be,
                                                CONCAT15(in_stack_ffffffffffffe8bd,
                                                         CONCAT14(in_stack_ffffffffffffe8bc,
                                                                  in_stack_ffffffffffffe8b8)))),
                           (int)((ulong)in_stack_ffffffffffffe8b0 >> 0x20));
            }
          }
        }
        else {
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::index(local_978,(char *)(ulong)local_97c,__c_02);
          local_3d8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::rhs(in_stack_ffffffffffffe8b0,
                            CONCAT13(in_stack_ffffffffffffe8af,
                                     CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac)))
          ;
          local_3d0 = local_d90;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
                     (cpp_dec_float<100U,_int,_void> *)
                     CONCAT17(in_stack_ffffffffffffe8af,
                              CONCAT16(in_stack_ffffffffffffe8ae,
                                       CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8)
                                      )));
          local_4e8 = infinity();
          local_4e0 = local_de0;
          local_4f0 = 0;
          local_268 = local_4e8;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    (in_stack_ffffffffffffe8c0,
                     (double)CONCAT17(in_stack_ffffffffffffe8bf,
                                      CONCAT16(in_stack_ffffffffffffe8be,
                                               CONCAT15(in_stack_ffffffffffffe8bd,
                                                        CONCAT14(in_stack_ffffffffffffe8bc,
                                                                 in_stack_ffffffffffffe8b8)))),
                     in_stack_ffffffffffffe8b0);
          SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_ffffffffffffe8af,
                                   CONCAT16(in_stack_ffffffffffffe8ae,
                                            CONCAT24(in_stack_ffffffffffffe8ac,
                                                     in_stack_ffffffffffffe8a8))));
          peVar7 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x5789d8);
          Tolerances::epsilon(peVar7);
          bVar2 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                            (in_stack_ffffffffffffe910,in_stack_ffffffffffffe908,
                             (double)in_stack_ffffffffffffe900);
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x578a1f);
          if (bVar2) {
            local_df4 = 0;
            tVar3 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT17(in_stack_ffffffffffffe8bf,
                                           CONCAT16(in_stack_ffffffffffffe8be,
                                                    CONCAT15(in_stack_ffffffffffffe8bd,
                                                             CONCAT14(in_stack_ffffffffffffe8bc,
                                                                      in_stack_ffffffffffffe8b8)))),
                               (int *)in_stack_ffffffffffffe8b0);
            if (tVar3) {
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_ffffffffffffe8b0,
                           CONCAT13(in_stack_ffffffffffffe8af,
                                    CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac)));
              boost::multiprecision::
              number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              ::operator++((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT17(in_stack_ffffffffffffe8bf,
                                       CONCAT16(in_stack_ffffffffffffe8be,
                                                CONCAT15(in_stack_ffffffffffffe8bd,
                                                         CONCAT14(in_stack_ffffffffffffe8bc,
                                                                  in_stack_ffffffffffffe8b8)))),
                           (int)((ulong)in_stack_ffffffffffffe8b0 >> 0x20));
            }
            else {
              local_e48 = 0;
              tVar3 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)CONCAT17(in_stack_ffffffffffffe8bf,
                                             CONCAT16(in_stack_ffffffffffffe8be,
                                                      CONCAT15(in_stack_ffffffffffffe8bd,
                                                               CONCAT14(in_stack_ffffffffffffe8bc,
                                                                        in_stack_ffffffffffffe8b8)))
                                            ),(int *)in_stack_ffffffffffffe8b0);
              if (tVar3) {
                VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe8b0,
                             CONCAT13(in_stack_ffffffffffffe8af,
                                      CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac))
                            );
                boost::multiprecision::
                number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                ::operator++((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT17(in_stack_ffffffffffffe8bf,
                                         CONCAT16(in_stack_ffffffffffffe8be,
                                                  CONCAT15(in_stack_ffffffffffffe8bd,
                                                           CONCAT14(in_stack_ffffffffffffe8bc,
                                                                    in_stack_ffffffffffffe8b8)))),
                             (int)((ulong)in_stack_ffffffffffffe8b0 >> 0x20));
              }
            }
          }
        }
      }
      else {
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_ffffffffffffe8b0,
                     CONCAT13(in_stack_ffffffffffffe8af,
                              CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac)));
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator++((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT17(in_stack_ffffffffffffe8bf,
                                 CONCAT16(in_stack_ffffffffffffe8be,
                                          CONCAT15(in_stack_ffffffffffffe8bd,
                                                   CONCAT14(in_stack_ffffffffffffe8bc,
                                                            in_stack_ffffffffffffe8b8)))),
                     (int)((ulong)in_stack_ffffffffffffe8b0 >> 0x20));
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_ffffffffffffe8b0,
                     CONCAT13(in_stack_ffffffffffffe8af,
                              CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac)));
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator++((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT17(in_stack_ffffffffffffe8bf,
                                 CONCAT16(in_stack_ffffffffffffe8be,
                                          CONCAT15(in_stack_ffffffffffffe8bd,
                                                   CONCAT14(in_stack_ffffffffffffe8bc,
                                                            in_stack_ffffffffffffe8b8)))),
                     (int)((ulong)in_stack_ffffffffffffe8b0 >> 0x20));
      }
    }
    local_3c8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::lower(in_stack_ffffffffffffe8b0,
                        CONCAT13(in_stack_ffffffffffffe8af,
                                 CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac)));
    local_3c0 = local_ee8;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe8af,
                        CONCAT16(in_stack_ffffffffffffe8ae,
                                 CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))));
    local_3b8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::upper(in_stack_ffffffffffffe8b0,
                        CONCAT13(in_stack_ffffffffffffe8af,
                                 CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac)));
    local_3b0 = &local_f38;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe8af,
                        CONCAT16(in_stack_ffffffffffffe8ae,
                                 CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))));
    local_3a0 = local_f88;
    local_3a8 = local_ee8;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe8af,
                        CONCAT16(in_stack_ffffffffffffe8ae,
                                 CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))));
    puVar8 = (ulong *)infinity();
    local_fe0 = *puVar8 ^ 0x8000000000000000;
    local_4c8 = local_fd8;
    local_4d0 = &local_fe0;
    local_4d8 = 0;
    local_270 = local_4d0;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (in_stack_ffffffffffffe8c0,
               (double)CONCAT17(in_stack_ffffffffffffe8bf,
                                CONCAT16(in_stack_ffffffffffffe8be,
                                         CONCAT15(in_stack_ffffffffffffe8bd,
                                                  CONCAT14(in_stack_ffffffffffffe8bc,
                                                           in_stack_ffffffffffffe8b8)))),
               in_stack_ffffffffffffe8b0);
    SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT17(in_stack_ffffffffffffe8af,
                             CONCAT16(in_stack_ffffffffffffe8ae,
                                      CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))
                            ));
    peVar7 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x578cb7);
    Tolerances::epsilon(peVar7);
    bVar2 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (in_stack_ffffffffffffe900,in_stack_ffffffffffffe8f8,
                       (double)in_stack_ffffffffffffe8f0);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x578cfe);
    if (bVar2) {
      local_e8 = &local_7ac;
      local_e0 = local_1090;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_e9,local_e8);
      local_d8 = local_e8;
      local_d0 = local_1090;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffe8af,
                          CONCAT16(in_stack_ffffffffffffe8ae,
                                   CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))));
      local_c8 = local_1090;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0);
      tVar3 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(in_stack_ffffffffffffe8af,
                                     CONCAT16(in_stack_ffffffffffffe8ae,
                                              CONCAT24(in_stack_ffffffffffffe8ac,
                                                       in_stack_ffffffffffffe8a8))),
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x578db6);
      if (tVar3) {
        local_118 = &local_7ac;
        local_110 = local_1040;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_119,local_118);
        local_108 = local_118;
        local_100 = local_1040;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffe8af,
                            CONCAT16(in_stack_ffffffffffffe8ae,
                                     CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8)))
                  );
        local_f8 = local_1040;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0);
      }
      else {
        local_390 = local_1040;
        local_398 = &local_f38;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffe8af,
                            CONCAT16(in_stack_ffffffffffffe8ae,
                                     CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8)))
                  );
      }
      local_340 = local_ee8;
      local_348 = local_1040;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffe8af,
                          CONCAT16(in_stack_ffffffffffffe8ae,
                                   CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))));
    }
    local_380 = local_10e0;
    local_388 = &local_f38;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe8af,
                        CONCAT16(in_stack_ffffffffffffe8ae,
                                 CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))));
    local_4b8 = infinity();
    local_4b0 = local_1130;
    local_4c0 = 0;
    local_278 = local_4b8;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (in_stack_ffffffffffffe8c0,
               (double)CONCAT17(in_stack_ffffffffffffe8bf,
                                CONCAT16(in_stack_ffffffffffffe8be,
                                         CONCAT15(in_stack_ffffffffffffe8bd,
                                                  CONCAT14(in_stack_ffffffffffffe8bc,
                                                           in_stack_ffffffffffffe8b8)))),
               in_stack_ffffffffffffe8b0);
    SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT17(in_stack_ffffffffffffe8af,
                             CONCAT16(in_stack_ffffffffffffe8ae,
                                      CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))
                            ));
    peVar7 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x578faf);
    Tolerances::epsilon(peVar7);
    bVar4 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (in_stack_ffffffffffffe910,in_stack_ffffffffffffe908,
                       (double)in_stack_ffffffffffffe900);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x578ff6);
    if ((bVar4 & 1) != 0) {
      in_stack_ffffffffffffe960 =
           SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::lower(in_stack_ffffffffffffe8b0,
                   CONCAT13(in_stack_ffffffffffffe8af,
                            CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac)));
      in_stack_ffffffffffffe95f =
           boost::multiprecision::operator>
                     ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)CONCAT17(in_stack_ffffffffffffe8af,
                                  CONCAT16(in_stack_ffffffffffffe8ae,
                                           CONCAT24(in_stack_ffffffffffffe8ac,
                                                    in_stack_ffffffffffffe8a8))),
                      (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)0x579039);
      if ((bool)in_stack_ffffffffffffe95f) {
        local_16b8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::lower(in_stack_ffffffffffffe8b0,
                             CONCAT13(in_stack_ffffffffffffe8af,
                                      CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac))
                            );
        in_stack_ffffffffffffe950 = local_16b8;
      }
      else {
        local_16b8 = &local_7ac;
      }
      local_2a0 = &local_f38;
      local_2a8 = local_16b8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffe8af,
                          CONCAT16(in_stack_ffffffffffffe8ae,
                                   CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))));
    }
    if ((local_759 & 1) != 0) {
      local_370 = local_1190;
      local_378 = local_ee8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffe8af,
                          CONCAT16(in_stack_ffffffffffffe8ae,
                                   CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))));
      local_11e8 = 0;
      local_498 = local_11e0;
      local_4a0 = &local_11e8;
      local_4a8 = 0;
      local_280 = local_4a0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (in_stack_ffffffffffffe8c0,
                 (double)CONCAT17(in_stack_ffffffffffffe8bf,
                                  CONCAT16(in_stack_ffffffffffffe8be,
                                           CONCAT15(in_stack_ffffffffffffe8bd,
                                                    CONCAT14(in_stack_ffffffffffffe8bc,
                                                             in_stack_ffffffffffffe8b8)))),
                 in_stack_ffffffffffffe8b0);
      feastol(in_stack_ffffffffffffe8e8);
      bVar2 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_ffffffffffffe910,in_stack_ffffffffffffe908,
                         in_stack_ffffffffffffe900);
      local_16ba = false;
      if (bVar2) {
        local_360 = local_1288;
        local_368 = &local_f38;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffe8af,
                            CONCAT16(in_stack_ffffffffffffe8ae,
                                     CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8)))
                  );
        local_12e0 = 0;
        local_480 = local_12d8;
        local_488 = &local_12e0;
        local_490 = 0;
        local_288 = local_488;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  (in_stack_ffffffffffffe8c0,
                   (double)CONCAT17(in_stack_ffffffffffffe8bf,
                                    CONCAT16(in_stack_ffffffffffffe8be,
                                             CONCAT15(in_stack_ffffffffffffe8bd,
                                                      CONCAT14(in_stack_ffffffffffffe8bc,
                                                               in_stack_ffffffffffffe8b8)))),
                   in_stack_ffffffffffffe8b0);
        feastol(in_stack_ffffffffffffe8e8);
        local_16ba = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                               (in_stack_ffffffffffffe960,
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)CONCAT17(in_stack_ffffffffffffe95f,in_stack_ffffffffffffe958),
                                in_stack_ffffffffffffe950);
      }
      if (local_16ba == false) {
        local_759 = 0;
      }
      else {
        local_1338[0] = 0;
        local_170 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe8b0,
                                 CONCAT13(in_stack_ffffffffffffe8af,
                                          CONCAT12(in_stack_ffffffffffffe8ae,
                                                   in_stack_ffffffffffffe8ac)));
        local_178 = local_1338;
        local_168 = local_178;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)CONCAT17(bVar4,in_stack_ffffffffffffe968),
                   (double)in_stack_ffffffffffffe960);
      }
    }
    local_2b0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe8b0,
                             CONCAT13(in_stack_ffffffffffffe8af,
                                      CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac))
                            );
    local_2b8 = local_ee8;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe8af,
                        CONCAT16(in_stack_ffffffffffffe8ae,
                                 CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))));
    local_2c0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe8b0,
                             CONCAT13(in_stack_ffffffffffffe8af,
                                      CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac))
                            );
    local_2c8 = &local_f38;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe8af,
                        CONCAT16(in_stack_ffffffffffffe8ae,
                                 CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))));
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_ffffffffffffe8b0,
                 CONCAT13(in_stack_ffffffffffffe8af,
                          CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac)));
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_ffffffffffffe8b0,
                 CONCAT13(in_stack_ffffffffffffe8af,
                          CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac)));
    tVar3 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT17(in_stack_ffffffffffffe8af,
                                   CONCAT16(in_stack_ffffffffffffe8ae,
                                            CONCAT24(in_stack_ffffffffffffe8ac,
                                                     in_stack_ffffffffffffe8a8))),
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x57941c);
    if (tVar3) {
      local_2d0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_ffffffffffffe8b0,
                               CONCAT13(in_stack_ffffffffffffe8af,
                                        CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac
                                                )));
      local_2d8 = &local_f38;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffe8af,
                          CONCAT16(in_stack_ffffffffffffe8ae,
                                   CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))));
    }
    else {
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_ffffffffffffe8b0,
                   CONCAT13(in_stack_ffffffffffffe8af,
                            CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac)));
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_ffffffffffffe8b0,
                   CONCAT13(in_stack_ffffffffffffe8af,
                            CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac)));
      tVar3 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(in_stack_ffffffffffffe8af,
                                     CONCAT16(in_stack_ffffffffffffe8ae,
                                              CONCAT24(in_stack_ffffffffffffe8ac,
                                                       in_stack_ffffffffffffe8a8))),
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x5794b8);
      if (tVar3) {
        local_2e0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe8b0,
                                 CONCAT13(in_stack_ffffffffffffe8af,
                                          CONCAT12(in_stack_ffffffffffffe8ae,
                                                   in_stack_ffffffffffffe8ac)));
        local_2e8 = local_ee8;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffe8af,
                            CONCAT16(in_stack_ffffffffffffe8ae,
                                     CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8)))
                  );
      }
      else {
        local_150 = local_ee8;
        local_158 = &local_f38;
        local_148 = &local_13d8;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_159,local_150,local_158);
        local_140 = &local_13d8;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0);
        local_130 = local_150;
        local_138 = local_158;
        local_128 = &local_13d8;
        boost::multiprecision::default_ops::
        eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffe8af,
                            CONCAT16(in_stack_ffffffffffffe8ae,
                                     CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8)))
                   ,(cpp_dec_float<100U,_int,_void> *)0x5795ca);
        local_13e0 = 0x4000000000000000;
        local_b0 = &local_13d8;
        local_b8 = &local_13e0;
        local_a8 = local_1388;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_b9,local_b0);
        local_a0 = local_1388;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0);
        local_98 = local_b0;
        local_88 = local_b8;
        local_90 = local_1388;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffe8af,
                            CONCAT16(in_stack_ffffffffffffe8ae,
                                     CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8)))
                   ,(double *)0x57968e);
        local_350 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffe8b0,
                                 CONCAT13(in_stack_ffffffffffffe8af,
                                          CONCAT12(in_stack_ffffffffffffe8ae,
                                                   in_stack_ffffffffffffe8ac)));
        local_358 = local_1388;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
                   (cpp_dec_float<100U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffe8af,
                            CONCAT16(in_stack_ffffffffffffe8ae,
                                     CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8)))
                  );
      }
    }
    in_stack_ffffffffffffe908 =
         SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ::maxObj(in_stack_ffffffffffffe8b0,
                  CONCAT13(in_stack_ffffffffffffe8af,
                           CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac)));
    local_1b0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe8b0,
                             CONCAT13(in_stack_ffffffffffffe8af,
                                      CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac))
                            );
    in_stack_ffffffffffffe910 = &local_1430;
    local_1a8 = in_stack_ffffffffffffe908;
    local_1a0 = in_stack_ffffffffffffe910;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_1b1,in_stack_ffffffffffffe908,local_1b0);
    local_198 = in_stack_ffffffffffffe910;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0);
    local_188 = local_1a8;
    local_190 = local_1b0;
    local_180 = in_stack_ffffffffffffe910;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe8af,
                        CONCAT16(in_stack_ffffffffffffe8ae,
                                 CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))),
               (cpp_dec_float<100U,_int,_void> *)0x5797ad);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
    ::operator+=(in_stack_ffffffffffffe8d0,
                 (self_type *)
                 CONCAT17(in_stack_ffffffffffffe8cf,
                          CONCAT16(in_stack_ffffffffffffe8ce,
                                   CONCAT15(in_stack_ffffffffffffe8cd,in_stack_ffffffffffffe8c8))));
    in_stack_ffffffffffffe8f8 =
         SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ::maxObj(in_stack_ffffffffffffe8b0,
                  CONCAT13(in_stack_ffffffffffffe8af,
                           CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac)));
    local_1f0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe8b0,
                             CONCAT13(in_stack_ffffffffffffe8af,
                                      CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac))
                            );
    in_stack_ffffffffffffe900 = &local_1480;
    local_1e8 = in_stack_ffffffffffffe8f8;
    local_1e0 = in_stack_ffffffffffffe900;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_1f1,in_stack_ffffffffffffe8f8,local_1f0);
    local_1d8 = in_stack_ffffffffffffe900;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0);
    local_1c8 = local_1e8;
    local_1d0 = local_1f0;
    local_1c0 = in_stack_ffffffffffffe900;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe8af,
                        CONCAT16(in_stack_ffffffffffffe8ae,
                                 CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))),
               (cpp_dec_float<100U,_int,_void> *)0x5798a0);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
    ::operator+=(in_stack_ffffffffffffe8d0,
                 (self_type *)
                 CONCAT17(in_stack_ffffffffffffe8cf,
                          CONCAT16(in_stack_ffffffffffffe8ce,
                                   CONCAT15(in_stack_ffffffffffffe8cd,in_stack_ffffffffffffe8c8))));
    in_stack_ffffffffffffe8e8 =
         (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::maxObj(in_stack_ffffffffffffe8b0,
                     CONCAT13(in_stack_ffffffffffffe8af,
                              CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac)));
    local_230 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe8b0,
                             CONCAT13(in_stack_ffffffffffffe8af,
                                      CONCAT12(in_stack_ffffffffffffe8ae,in_stack_ffffffffffffe8ac))
                            );
    in_stack_ffffffffffffe8f0 = local_14d0;
    local_228 = in_stack_ffffffffffffe8e8;
    local_220 = in_stack_ffffffffffffe8f0;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_231,
               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_stack_ffffffffffffe8e8,local_230);
    local_218 = in_stack_ffffffffffffe8f0;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0);
    local_208 = local_228;
    local_210 = local_230;
    local_200 = in_stack_ffffffffffffe8f0;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe8af,
                        CONCAT16(in_stack_ffffffffffffe8ae,
                                 CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))),
               (cpp_dec_float<100U,_int,_void> *)0x579993);
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
    ::operator+=(in_stack_ffffffffffffe8d0,
                 (self_type *)
                 CONCAT17(in_stack_ffffffffffffe8cf,
                          CONCAT16(in_stack_ffffffffffffe8ce,
                                   CONCAT15(in_stack_ffffffffffffe8cd,in_stack_ffffffffffffe8c8))));
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffe8b0,
               (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT17(in_stack_ffffffffffffe8af,
                           CONCAT16(in_stack_ffffffffffffe8ae,
                                    CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))))
  ;
  bVar2 = checkSolution(in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70,
                        in_stack_ffffffffffffeb68);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x579a17);
  if ((bVar2) &&
     (tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(in_stack_ffffffffffffe8af,
                                     CONCAT16(in_stack_ffffffffffffe8ae,
                                              CONCAT24(in_stack_ffffffffffffe8ac,
                                                       in_stack_ffffffffffffe8a8))),
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x579a40), tVar3)) {
    local_2f0 = in_RDI + 600;
    local_2f8 = local_6b8;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe8af,
                        CONCAT16(in_stack_ffffffffffffe8ae,
                                 CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))));
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_ffffffffffffe8b0,
               (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT17(in_stack_ffffffffffffe8af,
                           CONCAT16(in_stack_ffffffffffffe8ae,
                                    CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))))
  ;
  bVar4 = checkSolution(in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70,
                        in_stack_ffffffffffffeb68);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x579b06);
  if (((bVar4 & 1) != 0) &&
     (tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(in_stack_ffffffffffffe8af,
                                     CONCAT16(in_stack_ffffffffffffe8ae,
                                              CONCAT24(in_stack_ffffffffffffe8ac,
                                                       in_stack_ffffffffffffe8a8))),
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x579b2f), tVar3)) {
    local_300 = in_RDI + 600;
    local_308 = local_708;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe8af,
                        CONCAT16(in_stack_ffffffffffffe8ae,
                                 CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))));
  }
  bVar4 = 0;
  if ((local_759 & 1) != 0) {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_ffffffffffffe8b0,
                 (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT17(in_stack_ffffffffffffe8af,
                             CONCAT16(in_stack_ffffffffffffe8ae,
                                      CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))
                            ));
    bVar4 = checkSolution(in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70,
                          in_stack_ffffffffffffeb68);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x579c35);
  }
  if (((bVar4 & 1) != 0) &&
     (tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(in_stack_ffffffffffffe8af,
                                     CONCAT16(in_stack_ffffffffffffe8ae,
                                              CONCAT24(in_stack_ffffffffffffe8ac,
                                                       in_stack_ffffffffffffe8a8))),
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x579c5e), tVar3)) {
    local_310 = in_RDI + 600;
    local_318 = local_668;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              ((cpp_dec_float<100U,_int,_void> *)in_stack_ffffffffffffe8b0,
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffe8af,
                        CONCAT16(in_stack_ffffffffffffe8ae,
                                 CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))));
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)local_578,
               (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT17(in_stack_ffffffffffffe8af,
                           CONCAT16(in_stack_ffffffffffffe8ae,
                                    CONCAT24(in_stack_ffffffffffffe8ac,in_stack_ffffffffffffe8a8))))
  ;
  bVar4 = checkSolution(in_stack_ffffffffffffeb78,in_stack_ffffffffffffeb70,
                        in_stack_ffffffffffffeb68);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x579d30);
  if (((bVar4 & 1) != 0) &&
     (tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(bVar4,CONCAT16(in_stack_ffffffffffffe8ae,
                                                    CONCAT24(in_stack_ffffffffffffe8ac,
                                                             in_stack_ffffffffffffe8a8))),
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x579d59), tVar3)) {
    local_320 = in_RDI + 600;
    local_328 = local_758;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (local_578,
               (cpp_dec_float<100U,_int,_void> *)
               CONCAT17(bVar4,CONCAT16(tVar3,CONCAT24(in_stack_ffffffffffffe8ac,
                                                      in_stack_ffffffffffffe8a8))));
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x579dd8);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x579de5);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x579df2);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x579dff);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x579e0c);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x579e19);
  return;
}

Assistant:

void SPxMainSM<R>::trivialHeuristic(SPxLPBase<R>& lp)
{
   VectorBase<R>         zerosol(lp.nCols());  // the zero solution VectorBase<R>
   VectorBase<R>         lowersol(lp.nCols()); // the lower bound solution VectorBase<R>
   VectorBase<R>         uppersol(lp.nCols()); // the upper bound solution VectorBase<R>
   VectorBase<R>         locksol(lp.nCols());  // the locks solution VectorBase<R>

   VectorBase<R>         upLocks(lp.nCols());
   VectorBase<R>         downLocks(lp.nCols());

   R            zeroObj = this->m_objoffset;
   R            lowerObj = this->m_objoffset;
   R            upperObj = this->m_objoffset;
   R            lockObj = this->m_objoffset;

   bool            zerovalid = true;

   R largeValue = R(infinity);

   if(LT(R(1.0 / feastol()), R(infinity), this->tolerances()->epsilon()))
      largeValue = 1.0 / feastol();



   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      upLocks[j] = 0;
      downLocks[j] = 0;

      // computing the locks on the variables
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon())
               && LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            upLocks[j]++;
            downLocks[j]++;
         }
         else if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               downLocks[j]++;
            else if(aij < 0)
               upLocks[j]++;
         }
         else if(LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               upLocks[j]++;
            else if(aij < 0)
               downLocks[j]++;
         }
      }

      R lower = lp.lower(j);
      R upper = lp.upper(j);

      if(LE(lower, R(-infinity), this->tolerances()->epsilon()))
         lower = SOPLEX_MIN(-largeValue, upper);

      if(GE(upper, R(infinity), this->tolerances()->epsilon()))
         upper = SOPLEX_MAX(lp.lower(j), largeValue);

      if(zerovalid)
      {
         if(LE(lower, R(0.0), feastol()) && GE(upper, R(0.0), feastol()))
            zerosol[j] = 0.0;
         else
            zerovalid = false;
      }

      lowersol[j] = lower;
      uppersol[j] = upper;

      if(downLocks[j] > upLocks[j])
         locksol[j] = upper;
      else if(downLocks[j] < upLocks[j])
         locksol[j] = lower;
      else
         locksol[j] = (lower + upper) / 2.0;

      lowerObj += lp.maxObj(j) * lowersol[j];
      upperObj += lp.maxObj(j) * uppersol[j];
      lockObj += lp.maxObj(j) * locksol[j];
   }

   // trying the lower bound solution
   if(checkSolution(lp, lowersol))
   {
      if(lowerObj > m_cutoffbound)
         m_cutoffbound = lowerObj;
   }

   // trying the upper bound solution
   if(checkSolution(lp, uppersol))
   {
      if(upperObj > m_cutoffbound)
         m_cutoffbound = upperObj;
   }

   // trying the zero solution
   if(zerovalid && checkSolution(lp, zerosol))
   {
      if(zeroObj > m_cutoffbound)
         m_cutoffbound = zeroObj;
   }

   // trying the lock solution
   if(checkSolution(lp, locksol))
   {
      if(lockObj > m_cutoffbound)
         m_cutoffbound = lockObj;
   }
}